

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtest.cpp
# Opt level: O0

void __thiscall
DumpMetaArrayVal<double>::operator()(DumpMetaArrayVal<double> *this,PtexMetaData *meta,char *key)

{
  ostream *this_00;
  undefined8 in_RDX;
  long *in_RSI;
  int i;
  int count;
  double *val;
  int local_28;
  int local_24;
  long local_20 [4];
  
  local_20[0] = 0;
  local_24 = 0;
  (**(code **)(*in_RSI + 0x80))(in_RSI,in_RDX,local_20,&local_24);
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    if ((local_28 % 10 == 0) && ((local_28 != 0 || (10 < local_24)))) {
      std::operator<<((ostream *)&std::cout,"\n  ");
    }
    this_00 = std::operator<<((ostream *)&std::cout,"  ");
    std::ostream::operator<<(this_00,*(double *)(local_20[0] + (long)local_28 * 8));
  }
  return;
}

Assistant:

void operator()(PtexMetaData* meta, const char* key)
    {
        const T* val=0;
        int count=0;
        meta->getValue(key, val, count);
        for (int i = 0; i < count; i++) {
            if (i%10==0 && (i || count > 10)) std::cout << "\n  ";
            std::cout <<  "  " << val[i];
        }
    }